

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::ParsedScene::WorldBegin(ParsedScene *this,FileLoc loc)

{
  Float (*paFVar1) [4];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  Transform *pTVar33;
  mapped_type *pmVar34;
  int i;
  int i_00;
  Transform local_a8;
  
  if (this->currentApiState == WorldBlock) {
    local_a8.m.m[0]._0_8_ = local_a8.m.m + 1;
    local_a8.m.m[0][2] = 0.0;
    local_a8.m.m[0][3] = 0.0;
    local_a8.m.m[1]._0_8_ = (ulong)(uint7)local_a8.m.m[1]._1_7_ << 8;
    detail::stringPrintfRecursive<char_const(&)[11]>
              ((string *)&local_a8,
               "Options cannot be set inside world block; \"%s\" not allowed.  Ignoring.",
               (char (*) [11])"WorldBegin");
    Error(&loc,(char *)local_a8.m.m[0]._0_8_);
  }
  else {
    if (this->currentApiState != Uninitialized) {
      this->currentApiState = WorldBlock;
      i_00 = 0;
      do {
        local_a8.mInv.m[0][0] = 0.0;
        local_a8.mInv.m[0][1] = 0.0;
        local_a8.mInv.m[0][2] = 0.0;
        local_a8.mInv.m[0][3] = 0.0;
        local_a8.mInv.m[1][0] = 0.0;
        local_a8.mInv.m[1][1] = 0.0;
        local_a8.mInv.m[1][2] = 0.0;
        local_a8.mInv.m[1][3] = 0.0;
        local_a8.mInv.m[2][0] = 0.0;
        local_a8.mInv.m[2][1] = 0.0;
        local_a8.mInv.m[2][2] = 0.0;
        local_a8.mInv.m[2][3] = 0.0;
        local_a8.mInv.m[3][0] = 0.0;
        local_a8.mInv.m[3][1] = 0.0;
        local_a8.mInv.m[3][2] = 0.0;
        local_a8.mInv.m[3][3] = 0.0;
        local_a8.m.m[0][0] = 0.0;
        local_a8.m.m[0][1] = 0.0;
        local_a8.m.m[0][2] = 0.0;
        local_a8.m.m[0][3] = 0.0;
        local_a8.m.m[1][0] = 0.0;
        local_a8.m.m[1][1] = 0.0;
        local_a8.m.m[1][2] = 0.0;
        local_a8.m.m[1][3] = 0.0;
        local_a8.m.m[2][0] = 0.0;
        local_a8.m.m[2][1] = 0.0;
        local_a8.m.m[2][2] = 0.0;
        local_a8.m.m[2][3] = 0.0;
        local_a8.m.m[3][0] = 0.0;
        local_a8.m.m[3][1] = 0.0;
        local_a8.m.m[3][2] = 0.0;
        local_a8.m.m[3][3] = 0.0;
        pbrt::Transform::Transform(&local_a8);
        pTVar33 = TransformSet::operator[](&this->curTransform,i_00);
        *(undefined8 *)(pTVar33->m).m[0] = local_a8.m.m[0]._0_8_;
        *(undefined8 *)((pTVar33->m).m[0] + 2) = local_a8.m.m[0]._8_8_;
        *(undefined8 *)(pTVar33->m).m[1] = local_a8.m.m[1]._0_8_;
        *(undefined8 *)((pTVar33->m).m[1] + 2) = local_a8.m.m[1]._8_8_;
        *(undefined8 *)(pTVar33->m).m[2] = local_a8.m.m[2]._0_8_;
        *(undefined8 *)((pTVar33->m).m[2] + 2) = local_a8.m.m[2]._8_8_;
        *(undefined8 *)(pTVar33->m).m[3] = local_a8.m.m[3]._0_8_;
        *(undefined8 *)((pTVar33->m).m[3] + 2) = local_a8.m.m[3]._8_8_;
        *(undefined8 *)(pTVar33->mInv).m[0] = local_a8.mInv.m[0]._0_8_;
        *(undefined8 *)((pTVar33->mInv).m[0] + 2) = local_a8.mInv.m[0]._8_8_;
        *(undefined8 *)(pTVar33->mInv).m[1] = local_a8.mInv.m[1]._0_8_;
        *(undefined8 *)((pTVar33->mInv).m[1] + 2) = local_a8.mInv.m[1]._8_8_;
        *(undefined8 *)(pTVar33->mInv).m[2] = local_a8.mInv.m[2]._0_8_;
        *(undefined8 *)((pTVar33->mInv).m[2] + 2) = local_a8.mInv.m[2]._8_8_;
        *(undefined8 *)(pTVar33->mInv).m[3] = local_a8.mInv.m[3]._0_8_;
        *(undefined8 *)((pTVar33->mInv).m[3] + 2) = local_a8.mInv.m[3]._8_8_;
        i_00 = i_00 + 1;
      } while (i_00 == 1);
      this->activeTransformBits = 3;
      paFVar1 = local_a8.m.m + 1;
      local_a8.m.m[0]._0_8_ = paFVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"world","");
      pmVar34 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pbrt::TransformSet>_>_>
                ::operator[](&this->namedCoordinateSystems,(key_type *)&local_a8);
      uVar2 = *(undefined8 *)(this->curTransform).t[0].m.m[0];
      uVar3 = *(undefined8 *)((this->curTransform).t[0].m.m[0] + 2);
      uVar4 = *(undefined8 *)(this->curTransform).t[0].m.m[1];
      uVar5 = *(undefined8 *)((this->curTransform).t[0].m.m[1] + 2);
      uVar6 = *(undefined8 *)(this->curTransform).t[0].m.m[2];
      uVar7 = *(undefined8 *)((this->curTransform).t[0].m.m[2] + 2);
      uVar8 = *(undefined8 *)(this->curTransform).t[0].m.m[3];
      uVar9 = *(undefined8 *)((this->curTransform).t[0].m.m[3] + 2);
      uVar10 = *(undefined8 *)(this->curTransform).t[0].mInv.m[0];
      uVar11 = *(undefined8 *)((this->curTransform).t[0].mInv.m[0] + 2);
      uVar12 = *(undefined8 *)(this->curTransform).t[0].mInv.m[1];
      uVar13 = *(undefined8 *)((this->curTransform).t[0].mInv.m[1] + 2);
      uVar14 = *(undefined8 *)(this->curTransform).t[0].mInv.m[2];
      uVar15 = *(undefined8 *)((this->curTransform).t[0].mInv.m[2] + 2);
      uVar16 = *(undefined8 *)(this->curTransform).t[0].mInv.m[3];
      uVar17 = *(undefined8 *)((this->curTransform).t[0].mInv.m[3] + 2);
      uVar18 = *(undefined8 *)(this->curTransform).t[1].m.m[0];
      uVar19 = *(undefined8 *)((this->curTransform).t[1].m.m[0] + 2);
      uVar20 = *(undefined8 *)(this->curTransform).t[1].m.m[1];
      uVar21 = *(undefined8 *)((this->curTransform).t[1].m.m[1] + 2);
      uVar22 = *(undefined8 *)(this->curTransform).t[1].m.m[2];
      uVar23 = *(undefined8 *)((this->curTransform).t[1].m.m[2] + 2);
      uVar24 = *(undefined8 *)(this->curTransform).t[1].m.m[3];
      uVar25 = *(undefined8 *)((this->curTransform).t[1].m.m[3] + 2);
      uVar26 = *(undefined8 *)((this->curTransform).t[1].mInv.m[0] + 2);
      uVar27 = *(undefined8 *)(this->curTransform).t[1].mInv.m[1];
      uVar28 = *(undefined8 *)((this->curTransform).t[1].mInv.m[1] + 2);
      uVar29 = *(undefined8 *)(this->curTransform).t[1].mInv.m[2];
      uVar30 = *(undefined8 *)((this->curTransform).t[1].mInv.m[2] + 2);
      uVar31 = *(undefined8 *)(this->curTransform).t[1].mInv.m[3];
      uVar32 = *(undefined8 *)((this->curTransform).t[1].mInv.m[3] + 2);
      *(undefined8 *)pmVar34->t[1].mInv.m[0] = *(undefined8 *)(this->curTransform).t[1].mInv.m[0];
      *(undefined8 *)(pmVar34->t[1].mInv.m[0] + 2) = uVar26;
      *(undefined8 *)pmVar34->t[1].mInv.m[1] = uVar27;
      *(undefined8 *)(pmVar34->t[1].mInv.m[1] + 2) = uVar28;
      *(undefined8 *)pmVar34->t[1].mInv.m[2] = uVar29;
      *(undefined8 *)(pmVar34->t[1].mInv.m[2] + 2) = uVar30;
      *(undefined8 *)pmVar34->t[1].mInv.m[3] = uVar31;
      *(undefined8 *)(pmVar34->t[1].mInv.m[3] + 2) = uVar32;
      *(undefined8 *)pmVar34->t[1].m.m[0] = uVar18;
      *(undefined8 *)(pmVar34->t[1].m.m[0] + 2) = uVar19;
      *(undefined8 *)pmVar34->t[1].m.m[1] = uVar20;
      *(undefined8 *)(pmVar34->t[1].m.m[1] + 2) = uVar21;
      *(undefined8 *)pmVar34->t[1].m.m[2] = uVar22;
      *(undefined8 *)(pmVar34->t[1].m.m[2] + 2) = uVar23;
      *(undefined8 *)pmVar34->t[1].m.m[3] = uVar24;
      *(undefined8 *)(pmVar34->t[1].m.m[3] + 2) = uVar25;
      *(undefined8 *)pmVar34->t[0].mInv.m[0] = uVar10;
      *(undefined8 *)(pmVar34->t[0].mInv.m[0] + 2) = uVar11;
      *(undefined8 *)pmVar34->t[0].mInv.m[1] = uVar12;
      *(undefined8 *)(pmVar34->t[0].mInv.m[1] + 2) = uVar13;
      *(undefined8 *)pmVar34->t[0].mInv.m[2] = uVar14;
      *(undefined8 *)(pmVar34->t[0].mInv.m[2] + 2) = uVar15;
      *(undefined8 *)pmVar34->t[0].mInv.m[3] = uVar16;
      *(undefined8 *)(pmVar34->t[0].mInv.m[3] + 2) = uVar17;
      *(undefined8 *)pmVar34->t[0].m.m[0] = uVar2;
      *(undefined8 *)(pmVar34->t[0].m.m[0] + 2) = uVar3;
      *(undefined8 *)pmVar34->t[0].m.m[1] = uVar4;
      *(undefined8 *)(pmVar34->t[0].m.m[1] + 2) = uVar5;
      *(undefined8 *)pmVar34->t[0].m.m[2] = uVar6;
      *(undefined8 *)(pmVar34->t[0].m.m[2] + 2) = uVar7;
      *(undefined8 *)pmVar34->t[0].m.m[3] = uVar8;
      *(undefined8 *)(pmVar34->t[0].m.m[3] + 2) = uVar9;
      if ((Float (*) [4])local_a8.m.m[0]._0_8_ == paFVar1) {
        return;
      }
      goto LAB_005263d4;
    }
    local_a8.m.m[0]._0_8_ = local_a8.m.m + 1;
    local_a8.m.m[0][2] = 0.0;
    local_a8.m.m[0][3] = 0.0;
    local_a8.m.m[1]._0_8_ = (ulong)(uint7)local_a8.m.m[1]._1_7_ << 8;
    detail::stringPrintfRecursive<char_const(&)[11]>
              ((string *)&local_a8,"pbrtInit() must be before calling \"%s()\". Ignoring.",
               (char (*) [11])"WorldBegin");
    Error(&loc,(char *)local_a8.m.m[0]._0_8_);
  }
  if ((Float (*) [4])local_a8.m.m[0]._0_8_ == local_a8.m.m + 1) {
    return;
  }
LAB_005263d4:
  operator_delete((void *)local_a8.m.m[0]._0_8_,local_a8.m.m[1]._0_8_ + 1);
  return;
}

Assistant:

void ParsedScene::WorldBegin(FileLoc loc) {
    VERIFY_OPTIONS("WorldBegin");
    currentApiState = APIState::WorldBlock;
    for (int i = 0; i < MaxTransforms; ++i)
        curTransform[i] = pbrt::Transform();
    activeTransformBits = AllTransformsBits;
    namedCoordinateSystems["world"] = curTransform;
}